

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_289ba9::ArgParser::argZopfli(ArgParser *this)

{
  bool bVar1;
  element_type *peVar2;
  undefined1 local_20 [8];
  shared_ptr<QPDFLogger> logger;
  ArgParser *this_local;
  
  logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  QPDFLogger::defaultLogger();
  bVar1 = Pl_Flate::zopfli_supported();
  if (!bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_20);
    QPDFLogger::error(peVar2,"zopfli support is not enabled\n");
    exit(2);
  }
  bVar1 = Pl_Flate::zopfli_enabled();
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_20);
    QPDFLogger::info(peVar2,"zopfli support is enabled, and zopfli is active\n");
  }
  else {
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_20);
    QPDFLogger::info(peVar2,"zopfli support is enabled but not active\n");
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_20);
    QPDFLogger::info(peVar2,"Set the environment variable QPDF_ZOPFLI to activate.\n");
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_20);
    QPDFLogger::info(peVar2,"* QPDF_ZOPFLI=disabled or QPDF_ZOPFLI not set: don\'t use zopfli.\n");
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_20);
    QPDFLogger::info(peVar2,"* QPDF_ZOPFLI=force: use zopfli, and fail if not available.\n");
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_20);
    QPDFLogger::info(peVar2,
                     "* QPDF_ZOPFLI=silent: use zopfli if available and silently fall back if not.\n"
                    );
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_20);
    QPDFLogger::info(peVar2,
                     "* QPDF_ZOPFLI= any other value: use zopfli if available, and warn if not.\n");
  }
  std::shared_ptr<QPDFLogger>::~shared_ptr((shared_ptr<QPDFLogger> *)local_20);
  return;
}

Assistant:

void
ArgParser::argZopfli()
{
    auto logger = QPDFLogger::defaultLogger();
    if (Pl_Flate::zopfli_supported()) {
        if (Pl_Flate::zopfli_enabled()) {
            logger->info("zopfli support is enabled, and zopfli is active\n");
        } else {
            logger->info("zopfli support is enabled but not active\n");
            logger->info("Set the environment variable QPDF_ZOPFLI to activate.\n");
            logger->info("* QPDF_ZOPFLI=disabled or QPDF_ZOPFLI not set: don't use zopfli.\n");
            logger->info("* QPDF_ZOPFLI=force: use zopfli, and fail if not available.\n");
            logger->info(
                "* QPDF_ZOPFLI=silent: use zopfli if available and silently fall back if not.\n");
            logger->info(
                "* QPDF_ZOPFLI= any other value: use zopfli if available, and warn if not.\n");
        }
    } else {
        logger->error("zopfli support is not enabled\n");
        std::exit(qpdf_exit_error);
    }
}